

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int i;
  int iVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  code *pcVar6;
  ostream *poVar7;
  long *plVar8;
  long lVar9;
  uint domain_id;
  void *coreclr_handle;
  sum_ptr dele_sum;
  string coreclr_path;
  string tpa_list;
  bootstrap_ptr dele_bootstrap;
  char *property_values [2];
  char *property_keys [2];
  char pkg_path [4096];
  char app_path [4096];
  undefined4 local_2104;
  double local_2100;
  undefined8 local_20f8;
  code *local_20f0;
  long *local_20e8;
  long local_20e0;
  long local_20d8 [2];
  string local_20c8;
  code *local_20a8 [10];
  char *local_2058;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2050;
  undefined4 local_2048;
  undefined4 uStack_2044;
  undefined4 uStack_2040;
  undefined4 uStack_203c;
  char local_2038 [4096];
  char local_1038 [4104];
  
  if (argc == 2) {
    pcVar3 = realpath(*argv,local_1038);
    if (pcVar3 == (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"bad path ",9);
      pcVar3 = *argv;
    }
    else {
      pcVar3 = strrchr(local_1038,0x2f);
      if (pcVar3 != (char *)0x0) {
        *pcVar3 = '\0';
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"app_path:",9);
      sVar4 = strlen(local_1038);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_1038,sVar4);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
      std::ostream::put(-0x18);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Loading CoreCLR...",0x12);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
      std::ostream::put(-0x18);
      std::ostream::flush();
      pcVar3 = realpath(argv[1],local_2038);
      if (pcVar3 != (char *)0x0) {
        local_20e8 = local_20d8;
        sVar4 = strlen(local_2038);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_20e8,local_2038,local_2038 + sVar4);
        std::__cxx11::string::append((char *)&local_20e8);
        std::__cxx11::string::_M_append
                  ((char *)&local_20e8,(ulong)libcoreclr_abi_cxx11_._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"coreclr_path:",0xd);
        plVar8 = local_20e8;
        if (local_20e8 == (long *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1070e8);
        }
        else {
          sVar4 = strlen((char *)local_20e8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(char *)plVar8,sVar4);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
        std::ostream::put(-0x18);
        std::ostream::flush();
        lVar5 = dlopen(local_20e8,2);
        if (lVar5 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"failed to open ",0xf);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(char *)local_20e8,local_20e0);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"error: ",7);
          pcVar3 = (char *)dlerror();
          if (pcVar3 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x107180);
          }
          else {
            sVar4 = strlen(pcVar3);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar3,sVar4);
          }
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
          std::ostream::put(-0x80);
          iVar1 = -1;
          std::ostream::flush();
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Initializing CoreCLR...",0x17);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
          std::ostream::put(-0x18);
          std::ostream::flush();
          pcVar6 = (code *)dlsym(lVar5,"coreclr_initialize");
          if (pcVar6 == (code *)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"couldn\'t find coreclr_initialize in ",0x24);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(char *)local_20e8,local_20e0);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            iVar1 = -1;
            std::ostream::flush();
          }
          else {
            local_20c8._M_dataplus._M_p = (pointer)&local_20c8.field_2;
            local_20c8._M_string_length = 0;
            local_20c8.field_2._M_local_buf[0] = '\0';
            AddFilesFromDirectoryToTpaList(local_2038,&local_20c8);
            local_2048 = 0x1040f1;
            uStack_2044 = 0;
            uStack_2040 = 0x1040fb;
            uStack_203c = 0;
            local_2050 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)local_20c8._M_dataplus._M_p;
            local_2058 = local_1038;
            iVar1 = (*pcVar6)(local_1038,"host",2,&local_2048,&local_2058,&local_20f8,&local_2104);
            if (iVar1 < 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"failed to initialize coreclr. cerr = ",0x25);
              plVar8 = (long *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
              std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
              std::ostream::put((char)plVar8);
              iVar1 = -1;
              std::ostream::flush();
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Creating delegate...",0x14);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
              std::ostream::put(-0x18);
              std::ostream::flush();
              pcVar6 = (code *)dlsym(lVar5,"coreclr_create_delegate");
              if (pcVar6 == (code *)0x0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"couldn\'t find coreclr_create_delegate in ",0x29);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cerr,(char *)local_20e8,local_20e0);
                iVar1 = -1;
                std::endl<char,std::char_traits<char>>(poVar7);
              }
              else {
                iVar1 = (*pcVar6)(local_20f8,local_2104,"manlib","ManLib","Bootstrap",local_20a8);
                if (iVar1 < 0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"couldn\'t create delegate. err = ",0x20);
                  poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
                  iVar1 = -1;
                  std::endl<char,std::char_traits<char>>(poVar7);
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Calling ManLib::Bootstrap() through delegate..."
                             ,0x2f);
                  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                  pcVar3 = (char *)(*local_20a8[0])();
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"ManLib::Bootstrap() returned ",0x1d);
                  poVar7 = std::operator<<((ostream *)&std::cout,pcVar3);
                  std::endl<char,std::char_traits<char>>(poVar7);
                  free(pcVar3);
                  iVar1 = 0;
                  iVar2 = (*pcVar6)(local_20f8,local_2104,"manlib","ManLib","Plus",local_20a8);
                  if (iVar2 < 0) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"couldn\'t create delegate. err = ",0x20);
                    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
                    iVar1 = -1;
                    std::endl<char,std::char_traits<char>>(poVar7);
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"Calling ManLib::Plus() through delegate...",
                               0x2a);
                    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                    local_2100 = (double)(*local_20a8[0])(0,0x4000000000000000);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"ManLib::Plus(1, 2) returned ",0x1c);
                    poVar7 = std::ostream::_M_insert<double>(local_2100);
                    std::endl<char,std::char_traits<char>>(poVar7);
                    iVar2 = (*pcVar6)(local_20f8,local_2104,"manlib","ManLib","Sum",&local_20f0);
                    if (iVar2 < 0) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,"couldn\'t create delegate. err = ",0x20);
                      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
                      iVar1 = -1;
                      std::endl<char,std::char_traits<char>>(poVar7);
                    }
                    else {
                      lVar9 = 0;
                      do {
                        local_20a8[lVar9] = (code *)(double)(int)lVar9;
                        lVar9 = lVar9 + 1;
                      } while (lVar9 != 10);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"Calling ManLib::Sum() through delegate...",
                                 0x29);
                      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                      local_2100 = (double)(*local_20f0)(local_20a8,10);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"ManLib::Sum(1:10, 10) returned ",0x1f);
                      poVar7 = std::ostream::_M_insert<double>(local_2100);
                      std::endl<char,std::char_traits<char>>(poVar7);
                    }
                    if (-1 < iVar2) {
                      iVar2 = (*pcVar6)(local_20f8,local_2104,"manlib","ManLib","Sum2",&local_20f0);
                      if (iVar2 < 0) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,"couldn\'t create delegate. err = ",0x20);
                        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
                        iVar1 = -1;
                        std::endl<char,std::char_traits<char>>(poVar7);
                      }
                      else {
                        lVar9 = 0;
                        do {
                          local_20a8[lVar9] = (code *)(double)(int)lVar9;
                          lVar9 = lVar9 + 1;
                        } while (lVar9 != 10);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   "Calling ManLib::Sum2() through delegate...",0x2a);
                        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                        local_2100 = (double)(*local_20f0)(local_20a8,10);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,"ManLib::Sum2(1:10, 10) returned ",0x20);
                        poVar7 = std::ostream::_M_insert<double>(local_2100);
                        std::endl<char,std::char_traits<char>>(poVar7);
                      }
                      if (-1 < iVar2) {
                        dlclose(lVar5);
                      }
                    }
                  }
                }
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_20c8._M_dataplus._M_p != &local_20c8.field_2) {
              operator_delete(local_20c8._M_dataplus._M_p,
                              CONCAT71(local_20c8.field_2._M_allocated_capacity._1_7_,
                                       local_20c8.field_2._M_local_buf[0]) + 1);
            }
          }
        }
        if (local_20e8 == local_20d8) {
          return iVar1;
        }
        operator_delete(local_20e8,local_20d8[0] + 1);
        return iVar1;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"bad path ",9);
      pcVar3 = argv[1];
    }
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x107180);
    }
    else {
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar3,sVar4);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Usage: host <core_clr_path>",0x1b);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
  }
  std::ostream::put(-0x80);
  std::ostream::flush();
  return -1;
}

Assistant:

int main(int argc, char *argv[]) {
  if (argc != 2) {
    cerr << "Usage: host <core_clr_path>" << endl;
    return -1;
  }

  char app_path[PATH_MAX];
  if (realpath(argv[0], app_path) == NULL) {
    cerr << "bad path " << argv[0] << endl;
    return -1;
  }

  char *last_slash = strrchr(app_path, '/');
  if (last_slash != NULL)
    *last_slash = 0;

  cout << "app_path:" << app_path << endl;

  cout << "Loading CoreCLR..." << endl;

  char pkg_path[PATH_MAX];
  if (realpath(argv[1], pkg_path) == NULL) {
    cerr << "bad path " << argv[1] << endl;
    return -1;
  }

  //
  // Load CoreCLR
  //
  string coreclr_path(pkg_path);
  coreclr_path.append("/");
  coreclr_path.append(libcoreclr);

  cout << "coreclr_path:" << coreclr_path.c_str() << endl;

  void *coreclr = dlopen(coreclr_path.c_str(), RTLD_NOW | RTLD_LOCAL);
  if (coreclr == NULL) {
    cerr << "failed to open " << coreclr_path << endl;
    cerr << "error: " << dlerror() << endl;
    return -1;
  }

  //
  // Initialize CoreCLR
  //
  std::cout << "Initializing CoreCLR..." << endl;

  coreclr_initialize_ptr coreclr_init =
      reinterpret_cast<coreclr_initialize_ptr>(
          dlsym(coreclr, "coreclr_initialize"));
  if (coreclr_init == NULL) {
    cerr << "couldn't find coreclr_initialize in " << coreclr_path << endl;
    return -1;
  }

  string tpa_list;
  AddFilesFromDirectoryToTpaList(pkg_path, tpa_list);

  const char *property_keys[] = {"APP_PATHS", "TRUSTED_PLATFORM_ASSEMBLIES"};
  const char *property_values[] = {// APP_PATHS
                                   app_path,
                                   // TRUSTED_PLATFORM_ASSEMBLIES
                                   tpa_list.c_str()};

  void *coreclr_handle;
  unsigned int domain_id;
  int ret =
      coreclr_init(app_path, // exePath
                   "host",   // appDomainFriendlyName
                   sizeof(property_values) / sizeof(char *), // propertyCount
                   property_keys,                            // propertyKeys
                   property_values,                          // propertyValues
                   &coreclr_handle,                          // hostHandle
                   &domain_id                                // domainId
      );
  if (ret < 0) {
    cerr << "failed to initialize coreclr. cerr = " << ret << endl;
    return -1;
  }

  //
  // Once CoreCLR is initialized, bind to the delegate
  //
  std::cout << "Creating delegate..." << endl;
  coreclr_create_delegate_ptr coreclr_create_dele =
      reinterpret_cast<coreclr_create_delegate_ptr>(
          dlsym(coreclr, "coreclr_create_delegate"));
  if (coreclr_create_dele == NULL) {
    cerr << "couldn't find coreclr_create_delegate in " << coreclr_path << endl;
    return -1;
  }

  {
    // Create the delegate to ManLib::Bootstrap()
    bootstrap_ptr dele_bootstrap;
    ret = coreclr_create_dele(coreclr_handle, domain_id, "manlib", "ManLib",
                              "Bootstrap",
                              reinterpret_cast<void **>(&dele_bootstrap));
    if (ret < 0) {
      cerr << "couldn't create delegate. err = " << ret << endl;
      return -1;
    }

    // Call the delegate to ManLib::Bootstrap()
    cout << "Calling ManLib::Bootstrap() through delegate..." << endl;

    char *msg = dele_bootstrap();
    cout << "ManLib::Bootstrap() returned " << msg << endl;
    free(msg); // returned string need to be free-ed
  }

  {
    // Create the delegate to ManLib::Plus()
    plus_ptr dele_plus;
    ret = coreclr_create_dele(coreclr_handle, domain_id, "manlib", "ManLib",
                              "Plus", reinterpret_cast<void **>(&dele_plus));
    if (ret < 0) {
      cerr << "couldn't create delegate. err = " << ret << endl;
      return -1;
    }

    // Call the delegate to ManLib::Plus()
    cout << "Calling ManLib::Plus() through delegate..." << endl;

    double res = dele_plus(1, 2);
    cout << "ManLib::Plus(1, 2) returned " << res << endl;
  }

  {
    // Create the delegate to ManLib::Sum(double*, int)
    sum_ptr dele_sum;
    ret = coreclr_create_dele(coreclr_handle, domain_id, "manlib", "ManLib",
                              "Sum", reinterpret_cast<void **>(&dele_sum));
    if (ret < 0) {
      cerr << "couldn't create delegate. err = " << ret << endl;
      return -1;
    }

    // Call the delegate to ManLib::Sum()
    double nums[10];
    for (int i = 0; i < 10; i++) {
      nums[i] = i;
    }
    cout << "Calling ManLib::Sum() through delegate..." << endl;
    double sum = dele_sum(nums, 10);
    cout << "ManLib::Sum(1:10, 10) returned " << sum << endl;
  }

  {
    // Create the delegate to ManLib::Sum2(double*, int)
    sum_ptr dele_sum;
    ret = coreclr_create_dele(coreclr_handle, domain_id, "manlib", "ManLib",
                              "Sum2", reinterpret_cast<void **>(&dele_sum));
    if (ret < 0) {
      cerr << "couldn't create delegate. err = " << ret << endl;
      return -1;
    }

    // Call the delegate to ManLib::Sum()
    double nums[10];
    for (int i = 0; i < 10; i++) {
      nums[i] = i;
    }
    cout << "Calling ManLib::Sum2() through delegate..." << endl;
    double sum = dele_sum(nums, 10);
    cout << "ManLib::Sum2(1:10, 10) returned " << sum << endl;
  }

  dlclose(coreclr);
}